

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdfriendlist.cc
# Opt level: O0

void __thiscall bdFriendList::bdFriendList(bdFriendList *this,bdNodeId *ownId)

{
  undefined1 local_3c [8];
  bdId tmpId;
  bdNodeId *ownId_local;
  bdFriendList *this_local;
  
  tmpId.id.data._12_8_ = ownId;
  std::
  map<bdNodeId,_bdFriendEntry,_std::less<bdNodeId>,_std::allocator<std::pair<const_bdNodeId,_bdFriendEntry>_>_>
  ::map(&this->mPeers);
  bdId::bdId((bdId *)local_3c);
  tmpId.id.data._8_4_ = *(undefined4 *)(tmpId.id.data._12_8_ + 0x10);
  tmpId.addr.sin_zero = *(uchar (*) [8])tmpId.id.data._12_8_;
  tmpId.id.data._0_8_ = *(undefined8 *)(tmpId.id.data._12_8_ + 8);
  updatePeer(this,(bdId *)local_3c,0x100000);
  return;
}

Assistant:

bdFriendList::bdFriendList(const bdNodeId *ownId) {
	bdId tmpId;
	tmpId.id = *ownId;
	updatePeer(&tmpId, BD_FRIEND_ENTRY_SELF);
}